

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::preparePositionForFace
               (GLfloat *positions,GLuint cube_face,GLuint element_index,GLuint n_layers)

{
  float fVar1;
  float x;
  float x_00;
  GLfloat y_bottom;
  GLfloat y_middle;
  GLfloat y_top;
  GLfloat x_right;
  GLfloat x_middle;
  GLfloat x_left;
  GLfloat y_mid_step;
  GLfloat y_step;
  GLfloat x_mid_step;
  GLfloat x_step;
  GLuint x_offset_for_face;
  GLuint n_layers_local;
  GLuint element_index_local;
  GLuint cube_face_local;
  GLfloat *positions_local;
  
  fVar1 = 2.0 / (float)(n_layers * 3);
  x = (float)((cube_face + element_index * 6) * 3) * fVar1 + fVar1 * 0.5 + -1.0;
  x_00 = x + fVar1;
  fVar1 = x_00 + fVar1;
  vectorSet4(positions,0,x,0.6666666,0.0,1.0);
  vectorSet4(positions,1,x_00,0.6666666,0.0,1.0);
  vectorSet4(positions,2,fVar1,0.6666666,0.0,1.0);
  vectorSet4(positions,3,x,-5.9604645e-08,0.0,1.0);
  vectorSet4(positions,4,x_00,-5.9604645e-08,0.0,1.0);
  vectorSet4(positions,5,fVar1,-5.9604645e-08,0.0,1.0);
  vectorSet4(positions,6,x,-0.66666675,0.0,1.0);
  vectorSet4(positions,7,x_00,-0.66666675,0.0,1.0);
  vectorSet4(positions,8,fVar1,-0.66666675,0.0,1.0);
  return;
}

Assistant:

void preparePositionForFace(glw::GLfloat* positions, glw::GLuint cube_face, glw::GLuint element_index,
							glw::GLuint n_layers)
{
	static const glw::GLuint x_offset_per_face = 3;
	static const glw::GLuint n_faces		   = 6;

	const glw::GLuint x_offset_for_face = (element_index * n_faces + cube_face) * x_offset_per_face;

	const glw::GLfloat x_step	 = 2.0f / ((glw::GLfloat)(n_layers * 3));
	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_step	 = 2.0f / 3.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat x_left   = -1.0f + x_mid_step + ((glw::GLfloat)x_offset_for_face) * x_step;
	const glw::GLfloat x_middle = x_left + x_step;
	const glw::GLfloat x_right  = x_middle + x_step;

	const glw::GLfloat y_top	= 1.0f - y_mid_step;
	const glw::GLfloat y_middle = y_top - y_step;
	const glw::GLfloat y_bottom = y_middle - y_step;

	vectorSet4(positions, 0, x_left, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 1, x_middle, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 2, x_right, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 3, x_left, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 4, x_middle, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 5, x_right, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 6, x_left, y_bottom, 0.0f, 1.0f);
	vectorSet4(positions, 7, x_middle, y_bottom, 0.0f, 1.0f);
	vectorSet4(positions, 8, x_right, y_bottom, 0.0f, 1.0f);
}